

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

boolean is_racial_armor(obj *otmp,monst *mtmp)

{
  permonst *ppVar1;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  permonst *mdat;
  monst *mtmp_local;
  obj *otmp_local;
  
  if (mtmp == &youmonst) {
    if (urace.malenum == 0x2d) {
      local_29 = true;
      if (((otmp->otyp != 0x4a) && (local_29 = true, otmp->otyp != 0x6f)) &&
         (local_29 = true, otmp->otyp != 0x7f)) {
        local_29 = otmp->otyp == 0x8d;
      }
      return local_29;
    }
    if (urace.malenum == 0x111) {
      local_2a = true;
      if (((otmp->otyp != 0x48) && (local_2a = true, otmp->otyp != 0x70)) &&
         ((local_2a = true, otmp->otyp != 0x7d && (local_2a = true, otmp->otyp != 0x89)))) {
        local_2a = otmp->otyp == 0x99;
      }
      return local_2a;
    }
    if (urace.malenum == 0xaa) {
      return '\0';
    }
    if (urace.malenum == 0x4a) {
      local_2b = true;
      if (((otmp->otyp != 0x49) && (local_2b = true, otmp->otyp != 0x72)) &&
         ((local_2b = true, otmp->otyp != 0x76 &&
          ((local_2b = true, otmp->otyp != 0x7e && (local_2b = true, otmp->otyp != 0x8a)))))) {
        local_2b = otmp->otyp == 0x8b;
      }
      return local_2b;
    }
  }
  else if (mtmp != (monst *)0x0) {
    ppVar1 = mtmp->data;
    if ((ppVar1->mflags2 & 0x20) != 0) {
      local_2c = true;
      if (((otmp->otyp != 0x4a) && (local_2c = true, otmp->otyp != 0x6f)) &&
         (local_2c = true, otmp->otyp != 0x7f)) {
        local_2c = otmp->otyp == 0x8d;
      }
      return local_2c;
    }
    if ((ppVar1->mflags2 & 0x10) != 0) {
      local_2d = true;
      if (((otmp->otyp != 0x48) && (local_2d = true, otmp->otyp != 0x70)) &&
         ((local_2d = true, otmp->otyp != 0x7d && (local_2d = true, otmp->otyp != 0x89)))) {
        local_2d = otmp->otyp == 0x99;
      }
      return local_2d;
    }
    if ((ppVar1->mflags2 & 0x40) != 0) {
      return '\0';
    }
    if ((ppVar1->mflags2 & 0x80) != 0) {
      local_2e = true;
      if (((otmp->otyp != 0x49) && (local_2e = true, otmp->otyp != 0x72)) &&
         ((local_2e = true, otmp->otyp != 0x76 &&
          ((local_2e = true, otmp->otyp != 0x7e && (local_2e = true, otmp->otyp != 0x8a)))))) {
        local_2e = otmp->otyp == 0x8b;
      }
      return local_2e;
    }
  }
  return '\0';
}

Assistant:

boolean is_racial_armor(const struct obj *otmp, const struct monst *mtmp)
{
	if (mtmp == &youmonst) {
	    if (Race_if(PM_DWARF)) return is_dwarvish_armor(otmp);
	    else if (Race_if(PM_ELF)) return is_elven_armor(otmp);
	    else if (Race_if(PM_GNOME)) return is_gnomish_armor(otmp);
	    else if (Race_if(PM_ORC)) return is_orcish_armor(otmp);
	} else if (mtmp) {
	    const struct permonst *mdat = mtmp->data;
	    if (is_dwarf(mdat)) return is_dwarvish_armor(otmp);
	    else if (is_elf(mdat)) return is_elven_armor(otmp);
	    else if (is_gnome(mdat)) return is_gnomish_armor(otmp);
	    else if (is_orc(mdat)) return is_orcish_armor(otmp);
	}
	return FALSE;
}